

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

pmh_tables<8UL,_frozen::elsa<int>_> * __thiscall
frozen::bits::
make_pmh_tables<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,std::equal_to<int>,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
          (pmh_tables<8UL,_frozen::elsa<int>_> *__return_storage_ptr__,bits *this,
          carray<std::pair<const_int,_int>,_3UL> *items,elsa<int> *hash,equal_to<int> *equal,
          GetKey *key,linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> prg)

{
  long lVar1;
  ulong *puVar2;
  bool bVar3;
  uint uVar4;
  size_t i;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> prg_local;
  unsigned_long slot;
  cvector<unsigned_long,_4UL> bucket_slots;
  carray<unsigned_long,_8UL> H;
  carray<frozen::bits::seed_or_index,_8UL> G;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> buckets;
  pmh_buckets<8UL> step_one;
  
  prg_local.state_ = (result_type_conflict)key;
  make_pmh_buckets<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
            (&step_one,this,items,(elsa<int> *)equal,(GetKey *)&prg_local,
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)key);
  for (lVar6 = 0; lVar6 != 0x140; lVar6 = lVar6 + 0x28) {
    uVar8 = 1;
    while (uVar8 < *(ulong *)((long)step_one.buckets.data_[0].data + lVar6 + 0x20)) {
      lVar1 = uVar8 * 8;
      uVar8 = uVar8 + 1;
      if (*(int *)this == *(int *)(this + lVar1)) {
        __assert_fail("!equal(key(items[0]), key(items[i])) && \"unique keys\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/include/frozen/bits/pmh.h"
                      ,0xc9,
                      "pmh_tables<M, Hash> frozen::bits::make_pmh_tables(const carray<Item, N> &, const Hash &, const KeyEqual &, const Key &, PRG) [M = 8UL, Item = std::pair<const int, int>, N = 3UL, Hash = frozen::elsa<int>, Key = frozen::bits::GetKey, KeyEqual = std::equal_to<int>, PRG = frozen::linear_congruential_engine<unsigned long, 48271, 0, 2147483647>]"
                     );
      }
    }
  }
  pmh_buckets<8UL>::get_sorted_buckets(&buckets,&step_one);
  G.data_[0].value_ = 3;
  G.data_[1].value_ = 3;
  G.data_[2].value_ = 3;
  G.data_[3].value_ = 3;
  G.data_[4].value_ = 3;
  G.data_[5].value_ = 3;
  G.data_[6].value_ = 3;
  G.data_[7].value_ = 3;
  H.data_[0] = 3;
  H.data_[1] = 3;
  H.data_[2] = 3;
  H.data_[3] = 3;
  H.data_[4] = 3;
  H.data_[5] = 3;
  H.data_[6] = 3;
  H.data_[7] = 3;
  lVar6 = 0;
  do {
    if (lVar6 == 0x80) {
      __return_storage_ptr__->first_seed_ = step_one.seed;
      (__return_storage_ptr__->first_table_).data_[0].value_ = G.data_[0].value_;
      (__return_storage_ptr__->first_table_).data_[1].value_ = G.data_[1].value_;
      (__return_storage_ptr__->first_table_).data_[2].value_ = G.data_[2].value_;
      (__return_storage_ptr__->first_table_).data_[3].value_ = G.data_[3].value_;
      (__return_storage_ptr__->first_table_).data_[4].value_ = G.data_[4].value_;
      (__return_storage_ptr__->first_table_).data_[5].value_ = G.data_[5].value_;
      (__return_storage_ptr__->first_table_).data_[6].value_ = G.data_[6].value_;
      (__return_storage_ptr__->first_table_).data_[7].value_ = G.data_[7].value_;
      (__return_storage_ptr__->second_table_).data_[0] = H.data_[0];
      (__return_storage_ptr__->second_table_).data_[1] = H.data_[1];
      (__return_storage_ptr__->second_table_).data_[2] = H.data_[2];
      (__return_storage_ptr__->second_table_).data_[3] = H.data_[3];
      (__return_storage_ptr__->second_table_).data_[4] = H.data_[4];
      (__return_storage_ptr__->second_table_).data_[5] = H.data_[5];
      (__return_storage_ptr__->second_table_).data_[6] = H.data_[6];
      (__return_storage_ptr__->second_table_).data_[7] = H.data_[7];
      return __return_storage_ptr__;
    }
    puVar2 = *(ulong **)((long)&buckets.data_[0].ptr + lVar6);
    uVar8 = puVar2[4];
    if (uVar8 != 0) {
      if (uVar8 != 1) {
        bucket_slots.data[2] = 0;
        bucket_slots.data[3] = 0;
        bucket_slots.data[0] = 0;
        bucket_slots.data[1] = 0;
        bucket_slots.dsize = 0;
        do {
          prg_local.state_ = (prg_local.state_ * 0xbc8f) % 0x7fffffff;
          bucket_slots.dsize = 0;
          uVar7 = prg_local.state_ | 0x8000000000000000;
LAB_00178748:
          if (uVar8 <= bucket_slots.dsize) {
            G.data_[*(uint *)((long)&buckets.data_[0].hash + lVar6)].value_ = uVar7;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              H.data_[bucket_slots.data[uVar7]] =
                   *(unsigned_long *)(*(long *)((long)&buckets.data_[0].ptr + lVar6) + uVar7 * 8);
            }
            goto LAB_0017870c;
          }
          sVar5 = elsa<int>::operator()
                            ((elsa<int> *)items,
                             (int *)(this + *(long *)(*(long *)((long)&buckets.data_[0].ptr + lVar6)
                                                     + bucket_slots.dsize * 8) * 8),uVar7);
          uVar4 = (uint)sVar5 & 7;
          slot = (unsigned_long)uVar4;
          if (H.data_[uVar4] == 3) {
            bVar3 = all_different_from<unsigned_long,4ul>(&bucket_slots,&slot);
            sVar5 = bucket_slots.dsize;
            if (bVar3) goto code_r0x00178791;
          }
          bucket_slots.dsize = 0;
        } while( true );
      }
      G.data_[*(uint *)((long)&buckets.data_[0].hash + lVar6)].value_ = *puVar2 & 0x7fffffffffffffff
      ;
    }
LAB_0017870c:
    lVar6 = lVar6 + 0x10;
  } while( true );
code_r0x00178791:
  bucket_slots.dsize = bucket_slots.dsize + 1;
  bucket_slots.data[sVar5] = slot;
  goto LAB_00178748;
}

Assistant:

pmh_tables<M, Hash> constexpr make_pmh_tables(const carray<Item, N> &
                                                               items,
                                                           Hash const &hash,
                                                           KeyEqual const &equal,
                                                           Key const &key,
                                                           PRG prg) {
  // Step 1: Place all of the keys into buckets
  auto step_one = make_pmh_buckets<M>(items, hash, key, prg);

#ifndef NDEBUG
  // Step 1.5: Detect redundant keys.
  for(auto const& bucket : step_one.buckets)
    for(std::size_t i = 1; i < bucket.size(); ++i)
      constexpr_assert(!equal(key(items[0]), key(items[i])), "unique keys");
#endif

  // Step 2: Sort the buckets to process the ones with the most items first.
  auto buckets = step_one.get_sorted_buckets();

  // Special value for unused slots. This is purposefully the index
  // one-past-the-end of 'items' to function as a sentinel value. Both to avoid
  // the need to apply the KeyEqual predicate and to be easily convertible to
  // end().
  // Unused entries in both hash tables (G and H) have to contain this value.
  const auto UNUSED = items.size();

  // G becomes the first hash table in the resulting pmh function
  carray<seed_or_index, M> G({false, UNUSED});

  // H becomes the second hash table in the resulting pmh function
  carray<std::size_t, M> H(UNUSED);

  // Step 3: Map the items in buckets into hash tables.
  for (const auto & bucket : buckets) {
    auto const bsize = bucket.size();

    if (bsize == 1) {
      // Store index to the (single) item in G
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = {false, static_cast<std::uint64_t>(bucket[0])};
    } else if (bsize > 1) {

      // Repeatedly try different H of d until we find a hash function
      // that places all items in the bucket into free slots
      seed_or_index d{true, prg()};
      cvector<std::size_t, decltype(step_one)::bucket_max> bucket_slots;

      while (bucket_slots.size() < bsize) {
        auto slot = hash(key(items[bucket[bucket_slots.size()]]), static_cast<std::size_t>(d.value())) % M;

        if (H[slot] != UNUSED || !all_different_from(bucket_slots, slot)) {
          bucket_slots.clear();
          d = {true, prg()};
          continue;
        }

        bucket_slots.push_back(slot);
      }

      // Put successful seed in G, and put indices to items in their slots
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = d;
      for (std::size_t i = 0; i < bsize; ++i)
        H[bucket_slots[i]] = bucket[i];
    }
  }

  return {step_one.seed, G, H, hash};
}